

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O2

RefAST __thiscall antlr::ASTFactory::create(ASTFactory *this,int type)

{
  int in_EDX;
  undefined4 in_register_00000034;
  _func_int *p_Var1;
  allocator<char> local_39;
  string local_38 [32];
  
  (**(code **)(*(long *)(*(long *)(CONCAT44(in_register_00000034,type) + 0x18) + (long)in_EDX * 8) +
              8))();
  if (this->_vptr_ASTFactory == (_func_int **)0x0) {
    p_Var1 = (_func_int *)0x0;
  }
  else {
    p_Var1 = *this->_vptr_ASTFactory;
  }
  std::__cxx11::string::string<std::allocator<char>>(local_38,"",&local_39);
  (**(code **)(*(long *)p_Var1 + 0x88))(p_Var1,in_EDX,local_38);
  std::__cxx11::string::~string(local_38);
  return (RefAST)(ASTRef *)this;
}

Assistant:

RefAST ASTFactory::create(int type)
{
	RefAST t = nodeFactories[type]->second();
	t->initialize(type,"");
	return t;
}